

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O3

bool __thiscall
ON_CurveProxy::GetCurveParameterFromNurbFormParameter
          (ON_CurveProxy *this,double nurbs_t,double *curve_t)

{
  bool bVar1;
  int iVar2;
  ON_ArcCurve *pOVar3;
  undefined4 extraout_var;
  ON_Curve *pOVar5;
  double dVar6;
  ON_Interval local_40;
  ON_Curve *pOVar4;
  
  pOVar5 = this->m_real_curve;
  if (pOVar5 == (ON_Curve *)0x0) {
    return false;
  }
  (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar5);
  bVar1 = ON_Interval::operator!=(&this->m_real_curve_domain,&local_40);
  if ((bVar1) &&
     (pOVar3 = ON_ArcCurve::Cast((ON_Object *)this->m_real_curve), pOVar3 != (ON_ArcCurve *)0x0)) {
    iVar2 = (*(pOVar3->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x24])
                      (pOVar3);
    pOVar4 = (ON_Curve *)CONCAT44(extraout_var,iVar2);
    if (pOVar4 != (ON_Curve *)0x0) {
      iVar2 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3c])
                        (pOVar4,&this->m_real_curve_domain);
      if ((char)iVar2 != '\0') {
        pOVar5 = pOVar4;
      }
      goto LAB_00431de2;
    }
  }
  pOVar4 = (ON_Curve *)0x0;
LAB_00431de2:
  RealCurveParameter(this,nurbs_t);
  iVar2 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x41])(pOVar5,curve_t);
  if ((char)iVar2 != '\0') {
    dVar6 = ThisCurveParameter(this,*curve_t);
    *curve_t = dVar6;
  }
  if (pOVar4 != (ON_Curve *)0x0) {
    (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar4);
  }
  return (bool)(char)iVar2;
}

Assistant:

bool ON_CurveProxy::GetCurveParameterFromNurbFormParameter(
      double nurbs_t,
      double* curve_t
      ) const
{
  bool rc = false;
  if ( m_real_curve ) 
  {
    // 18 June 2003 Dale Lear and Chuck
    //     Fixing joining bug in STEP TEST 2 caused by error
    //     in converting NURBS parameter to arc parameter.
    const ON_Curve* real_crv = m_real_curve;

    ON_Curve* tmp_real_crv = 0;
    if ( m_real_curve_domain != m_real_curve->Domain() )
    {
      const ON_ArcCurve* arc_curve = ON_ArcCurve::Cast(m_real_curve);
      if ( 0 != arc_curve )
      {
        tmp_real_crv = arc_curve->DuplicateCurve();
        if ( 0 != tmp_real_crv )
        {
          if ( tmp_real_crv->Trim(m_real_curve_domain) )
          {
            real_crv = tmp_real_crv;
          }
        }
      }
    }

    rc = real_crv->GetCurveParameterFromNurbFormParameter( RealCurveParameter(nurbs_t),curve_t);
    if ( rc )
      *curve_t = ThisCurveParameter(*curve_t);

    if ( 0 != tmp_real_crv )
      delete tmp_real_crv;
  }
  return rc;
}